

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall FIX::Parser::extractLength(Parser *this,int *length,size_type *pos,string *buffer)

{
  int iVar1;
  long lVar2;
  MessageParseError *this_00;
  ulong uVar3;
  bool bVar4;
  string strLength;
  string local_70;
  string local_50;
  
  if (buffer->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar2 = std::__cxx11::string::find((char *)buffer,0x1cc4e3,0);
    if (lVar2 != -1) {
      uVar3 = lVar2 + 3;
      lVar2 = std::__cxx11::string::find((char *)buffer,0x1cc4e7,uVar3);
      bVar4 = lVar2 != -1;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_50,(string *)buffer,uVar3,lVar2 - uVar3);
        iVar1 = IntTConvertor<int>::convert(&local_50);
        *length = iVar1;
        if (iVar1 < 0) {
          this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
          MessageParseError::MessageParseError(this_00,&local_70);
          __cxa_throw(this_00,&MessageParseError::typeinfo,FIX::Exception::~Exception);
        }
        *pos = lVar2 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
      }
    }
  }
  return bVar4;
}

Assistant:

EXCEPT(MessageParseError) {
  if (!buffer.size()) {
    return false;
  }

  std::string::size_type startPos = buffer.find("\0019=", 0);
  if (startPos == std::string::npos) {
    return false;
  }
  startPos += 3;
  std::string::size_type endPos = buffer.find("\001", startPos);
  if (endPos == std::string::npos) {
    return false;
  }

  std::string strLength(buffer, startPos, endPos - startPos);

  try {
    length = IntConvertor::convert(strLength);
    if (length < 0) {
      throw MessageParseError();
    }
  } catch (FieldConvertError &) {
    throw MessageParseError();
  }

  pos = endPos + 1;
  return true;
}